

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O2

void run_bitset_container_union
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  int iVar1;
  int32_t rlepos;
  long lVar2;
  
  if (src_2 != dst) {
    bitset_container_copy(src_2,dst);
  }
  for (lVar2 = 0; lVar2 < src_1->n_runs; lVar2 = lVar2 + 1) {
    bitset_set_lenrange(dst->words,(uint)src_1->runs[lVar2].value,(uint)src_1->runs[lVar2].length);
  }
  iVar1 = bitset_container_compute_cardinality(dst);
  dst->cardinality = iVar1;
  return;
}

Assistant:

void run_bitset_container_union(const run_container_t *src_1,
                                const bitset_container_t *src_2,
                                bitset_container_t *dst) {
    assert(!run_container_is_full(src_1));  // catch this case upstream
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_set_lenrange(dst->words, rle.value, rle.length);
    }
    dst->cardinality = bitset_container_compute_cardinality(dst);
}